

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::EglConfig::EglConfig(EglConfig *this)

{
  EglConfig *this_local;
  
  Item::Item(&this->super_Item,TYPE_EGLCONFIG);
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__EglConfig_001b34f8;
  *(undefined4 *)&(this->super_Item).field_0xc = 0;
  this->redSize = 0;
  this->greenSize = 0;
  this->blueSize = 0;
  this->luminanceSize = 0;
  this->alphaSize = 0;
  this->alphaMaskSize = 0;
  this->bindToTextureRGB = false;
  this->bindToTextureRGBA = false;
  std::__cxx11::string::string((string *)&this->colorBufferType);
  std::__cxx11::string::string((string *)&this->configCaveat);
  this->configID = 0;
  std::__cxx11::string::string((string *)&this->conformant);
  this->depthSize = 0;
  this->level = 0;
  this->maxPBufferWidth = 0;
  this->maxPBufferHeight = 0;
  this->maxPBufferPixels = 0;
  this->maxSwapInterval = 0;
  this->minSwapInterval = 0;
  this->nativeRenderable = false;
  std::__cxx11::string::string((string *)&this->renderableType);
  this->sampleBuffers = 0;
  this->samples = 0;
  this->stencilSize = 0;
  std::__cxx11::string::string((string *)&this->surfaceTypes);
  std::__cxx11::string::string((string *)&this->transparentType);
  this->transparentRedValue = 0;
  this->transparentGreenValue = 0;
  this->transparentBlueValue = 0;
  return;
}

Assistant:

inline EglConfig::EglConfig (void)
	: Item					(TYPE_EGLCONFIG)
	, bufferSize			(0)
	, redSize				(0)
	, greenSize				(0)
	, blueSize				(0)
	, luminanceSize			(0)
	, alphaSize				(0)
	, alphaMaskSize			(0)
	, bindToTextureRGB		(false)
	, bindToTextureRGBA		(false)
	, configID				(0)
	, depthSize				(0)
	, level					(0)
	, maxPBufferWidth		(0)
	, maxPBufferHeight		(0)
	, maxPBufferPixels		(0)
	, maxSwapInterval		(0)
	, minSwapInterval		(0)
	, nativeRenderable		(false)
	, sampleBuffers			(0)
	, samples				(0)
	, stencilSize			(0)
	, transparentRedValue	(0)
	, transparentGreenValue	(0)
	, transparentBlueValue	(0)
{
}